

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O2

bilingual_str * __thiscall
tinyformat::format<std::__cxx11::string,char_const*>
          (bilingual_str *__return_storage_ptr__,tinyformat *this,bilingual_str *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char **args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  format<std::__cxx11::string,char_const*>
            (&__return_storage_ptr__->original,this,&fmt->original,args,args_1);
  format<std::__cxx11::string,char_const*>
            (&__return_storage_ptr__->translated,this + 0x20,&fmt->original,args,args_1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}